

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

size_t __thiscall PClassActor::PropagateMark(PClassActor *this)

{
  FState *pFVar1;
  DObject *pDVar2;
  BYTE *pBVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  anon_union_8_2_947301c6 anon_var_0;
  DObject *local_30;
  
  iVar4 = this->NumOwnedStates;
  if (0 < iVar4) {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pFVar1 = this->OwnedStates;
      pDVar2 = *(DObject **)((long)&pFVar1->NextState + lVar7);
      if (pDVar2 != (DObject *)0x0) {
        local_30 = pDVar2;
        GC::Mark(&local_30);
        *(DObject **)((long)&pFVar1->NextState + lVar7) = local_30;
        iVar4 = this->NumOwnedStates;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x28;
    } while (lVar6 < iVar4);
  }
  pBVar3 = (this->super_PClass).Defaults;
  if (pBVar3 != (BYTE *)0x0) {
    local_30 = *(DObject **)(pBVar3 + 0x1b0);
    GC::Mark(&local_30);
    *(DObject **)(pBVar3 + 0x1b0) = local_30;
  }
  sVar5 = PStruct::PropagateMark((PStruct *)this);
  return sVar5;
}

Assistant:

size_t PClassActor::PropagateMark()
{
	// Mark state functions
	for (int i = 0; i < NumOwnedStates; ++i)
	{
		if (OwnedStates[i].ActionFunc != NULL)
		{
			GC::Mark(OwnedStates[i].ActionFunc);
		}
	}
	// Mark damage function
	if (Defaults != NULL)
	{
		GC::Mark(((AActor *)Defaults)->DamageFunc);
	}

//	marked += ActorInfo->NumOwnedStates * sizeof(FState);
	return Super::PropagateMark();
}